

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesBufferTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::sparse::anon_unknown_0::UBOTestInstance::iterate
          (TestStatus *__return_storage_ptr__,UBOTestInstance *this)

{
  Move<vk::Handle<(vk::HandleType)19>_> *pMVar1;
  Move<vk::Handle<(vk::HandleType)22>_> *pMVar2;
  byte bVar3;
  DeviceDriver *this_00;
  VkDescriptorSetLayout VVar4;
  VkDescriptorPool VVar5;
  SparseAllocation *pSVar6;
  DeviceInterface *pDVar7;
  VkDevice device;
  VkBuffer obj;
  pointer pVVar8;
  Allocation *pAVar9;
  VkBufferCreateInfo referenceCreateInfo;
  VkBufferCreateInfo referenceCreateInfo_00;
  VkBufferCreateInfo referenceCreateInfo_01;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  pointer pVVar13;
  VkDescriptorPool VVar14;
  VkCommandBuffer_s *pVVar15;
  TestStatus *__return_storage_ptr___00;
  VkPhysicalDeviceProperties *pVVar16;
  undefined4 *puVar17;
  DescriptorSetLayoutBuilder *this_01;
  DescriptorPoolBuilder *this_02;
  DescriptorSetUpdateBuilder *this_03;
  mapped_type *ppVVar18;
  ulong uVar19;
  VkBuffer *pVVar20;
  uint uVar21;
  pointer pWVar22;
  VkStructureType VVar23;
  VkDevice pVVar24;
  deUint32 numChunks;
  UBOTestInstance *pUVar25;
  SparseAllocationBuilder *this_04;
  ulong uVar26;
  bool bVar27;
  UniquePtr<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
  minAllocation;
  SparseAllocationBuilder builder;
  VkBufferCreateInfo referenceBufferCreateInfo;
  vector<int,_std::allocator<int>_> specializationData;
  MovePtr<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
  sparseAllocation;
  undefined1 local_1a8 [16];
  pointer local_198;
  pointer pVStack_190;
  undefined1 local_188 [16];
  vector<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
  local_178;
  pointer local_160;
  pointer local_158;
  pointer local_150;
  pointer local_148;
  undefined1 local_138 [16];
  pointer local_128;
  VkDescriptorPool VStack_120;
  VkBufferUsageFlags local_118;
  VkSharingMode VStack_114;
  deUint32 dStack_110;
  undefined4 uStack_10c;
  deUint32 *local_108;
  Move<vk::VkCommandBuffer_s_*> local_f8;
  VkBuffer local_d8;
  Deleter<vk::Handle<(vk::HandleType)8>_> DStack_d0;
  VkBuffer local_b8;
  Deleter<vk::Handle<(vk::HandleType)8>_> DStack_b0;
  TestStatus *local_98;
  SparseAllocation *local_90;
  UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
  local_88;
  key_type local_78 [4];
  ulong local_68;
  _Rb_tree<vk::VkShaderStageFlagBits,_std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>,_std::_Select1st<std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>_>_>
  local_60;
  
  this_00 = (this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.m_deviceDriver.
            super_UniqueBase<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_>.m_data.ptr;
  local_88.m_data.ptr = (SparseAllocation *)0x0;
  DStack_d0.m_device = (VkDevice)0x0;
  DStack_d0.m_allocator = (VkAllocationCallbacks *)0x0;
  local_d8.m_internal = 0;
  DStack_d0.m_deviceIface = (DeviceInterface *)0x0;
  DStack_b0.m_device = (VkDevice)0x0;
  DStack_b0.m_allocator = (VkAllocationCallbacks *)0x0;
  local_b8.m_internal = 0;
  DStack_b0.m_deviceIface = (DeviceInterface *)0x0;
  local_138._0_4_ = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  local_138._8_8_ = (DeviceInterface *)0x0;
  local_128 = (pointer)CONCAT44(local_128._4_4_,
                                (uint)(this->super_SparseBufferTestInstance).m_residency * 2 +
                                (uint)(this->super_SparseBufferTestInstance).m_aliased * 4 + 1);
  VStack_120.m_internal = 0;
  local_118 = 0x12;
  dStack_110 = 0;
  local_108 = (deUint32 *)0x0;
  bVar27 = (this->super_SparseBufferTestInstance).m_sparseQueue.queueFamilyIndex !=
           (this->super_SparseBufferTestInstance).m_universalQueue.queueFamilyIndex;
  if (bVar27) {
    dStack_110 = 2;
    local_108 = (this->super_SparseBufferTestInstance).m_sharedQueueFamilyIndices;
  }
  VStack_114 = (VkSharingMode)bVar27;
  pUVar25 = this;
  SparseAllocationBuilder::SparseAllocationBuilder((SparseAllocationBuilder *)local_188);
  SparseAllocationBuilder::addMemoryBind((SparseAllocationBuilder *)local_188,(deUint32)pUVar25);
  referenceCreateInfo.sharingMode = VStack_114;
  referenceCreateInfo.usage = local_118;
  referenceCreateInfo._44_4_ = uStack_10c;
  referenceCreateInfo.queueFamilyIndexCount = dStack_110;
  this_04 = (SparseAllocationBuilder *)local_188;
  referenceCreateInfo.pNext._0_4_ = (int)local_138._8_8_;
  referenceCreateInfo._0_8_ = local_138._0_8_;
  referenceCreateInfo.pNext._4_4_ = SUB84(local_138._8_8_,4);
  referenceCreateInfo._16_8_ = local_128;
  referenceCreateInfo.size = VStack_120.m_internal;
  referenceCreateInfo.pQueueFamilyIndices = local_108;
  SparseAllocationBuilder::build
            ((MovePtr<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
              *)&local_f8,this_04,&this_00->super_DeviceInterface,
             (this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.
             m_logicalDevice.super_RefBase<vk::VkDevice_s_*>.m_data.object,
             (this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.m_allocator.
             super_UniqueBase<vk::Allocator,_de::DefaultDeleter<vk::Allocator>_>.m_data.ptr,
             referenceCreateInfo,0x200);
  pVVar15 = local_f8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object;
  numChunks = (deUint32)this_04;
  local_f8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object = (VkCommandBuffer_s *)0x0;
  local_1a8._0_8_ = pVVar15;
  de::details::
  UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
  ::reset((UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
           *)&local_f8);
  if (local_160 != (pointer)0x0) {
    uVar26 = (long)local_150 - (long)local_160;
    operator_delete(local_160,uVar26);
    numChunks = (deUint32)uVar26;
  }
  if ((pointer)local_178.
               super__Vector_base<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
               ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    uVar26 = (long)local_178.
                   super__Vector_base<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
             (long)local_178.
                   super__Vector_base<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    operator_delete(local_178.
                    super__Vector_base<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
                    ._M_impl.super__Vector_impl_data._M_start,uVar26);
    numChunks = (deUint32)uVar26;
  }
  pVVar16 = Context::getDeviceProperties
                      ((this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.
                       super_TestInstance.m_context);
  uVar21 = (pVVar16->limits).maxUniformBufferRange;
  uVar26 = *(VkDeviceSize *)((long)pVVar15 + 8);
  de::details::
  UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
  ::reset((UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
           *)local_1a8);
  if ((uint)(uVar21 / uVar26) < 4) {
    SparseAllocationBuilder::SparseAllocationBuilder((SparseAllocationBuilder *)local_188);
    SparseAllocationBuilder::addMemoryBind((SparseAllocationBuilder *)local_188,numChunks);
    referenceCreateInfo_00.sharingMode = VStack_114;
    referenceCreateInfo_00.usage = local_118;
    referenceCreateInfo_00._44_4_ = uStack_10c;
    referenceCreateInfo_00.queueFamilyIndexCount = dStack_110;
    referenceCreateInfo_00.pNext._0_4_ = (int)local_138._8_8_;
    referenceCreateInfo_00._0_8_ = local_138._0_8_;
    referenceCreateInfo_00.pNext._4_4_ = SUB84(local_138._8_8_,4);
    referenceCreateInfo_00._16_8_ = local_128;
    referenceCreateInfo_00.size = VStack_120.m_internal;
    referenceCreateInfo_00.pQueueFamilyIndices = local_108;
    SparseAllocationBuilder::build
              ((MovePtr<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
                *)local_1a8,(SparseAllocationBuilder *)local_188,&this_00->super_DeviceInterface,
               (this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.
               m_logicalDevice.super_RefBase<vk::VkDevice_s_*>.m_data.object,
               (this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.m_allocator.
               super_UniqueBase<vk::Allocator,_de::DefaultDeleter<vk::Allocator>_>.m_data.ptr,
               referenceCreateInfo_00,0x200);
  }
  else {
    SparseAllocationBuilder::SparseAllocationBuilder((SparseAllocationBuilder *)local_188);
    SparseAllocationBuilder::addMemoryBind((SparseAllocationBuilder *)local_188,numChunks);
    if ((this->super_SparseBufferTestInstance).m_residency == true) {
      local_188._4_4_ = local_188._4_4_ + 1;
    }
    SparseAllocationBuilder::addMemoryAllocation((SparseAllocationBuilder *)local_188);
    local_188._8_4_ = local_188._8_4_ + _S_black;
    (&local_160->sType)[local_188._0_8_ & 0xffffffff] =
         (&local_160->sType)[local_188._0_8_ & 0xffffffff] + VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO;
    SparseAllocationBuilder::addMemoryBind((SparseAllocationBuilder *)local_188,numChunks);
    if ((this->super_SparseBufferTestInstance).m_aliased == true) {
      local_1a8._0_8_ = local_188._0_8_ & 0xffffffff00000000;
      local_1a8._8_8_ = (pointer)0x100000000;
      std::
      vector<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
      ::push_back(&local_178,(value_type *)local_1a8);
      local_188._4_4_ = local_188._4_4_ + 1;
    }
    referenceCreateInfo_01.sharingMode = VStack_114;
    referenceCreateInfo_01.usage = local_118;
    referenceCreateInfo_01._44_4_ = uStack_10c;
    referenceCreateInfo_01.queueFamilyIndexCount = dStack_110;
    referenceCreateInfo_01.pNext._0_4_ = (int)local_138._8_8_;
    referenceCreateInfo_01._0_8_ = local_138._0_8_;
    referenceCreateInfo_01.pNext._4_4_ = SUB84(local_138._8_8_,4);
    referenceCreateInfo_01._16_8_ = local_128;
    referenceCreateInfo_01.size = VStack_120.m_internal;
    referenceCreateInfo_01.pQueueFamilyIndices = local_108;
    SparseAllocationBuilder::build
              ((MovePtr<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
                *)local_1a8,(SparseAllocationBuilder *)local_188,&this_00->super_DeviceInterface,
               (this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.
               m_logicalDevice.super_RefBase<vk::VkDevice_s_*>.m_data.object,
               (this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.m_allocator.
               super_UniqueBase<vk::Allocator,_de::DefaultDeleter<vk::Allocator>_>.m_data.ptr,
               referenceCreateInfo_01,0x200);
  }
  uVar10 = local_1a8._0_8_;
  local_1a8._0_8_ = (SparseAllocation *)0x0;
  if ((SparseAllocation *)uVar10 != (SparseAllocation *)0x0) {
    de::details::
    UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
    ::reset(&local_88);
    local_88.m_data.ptr = (SparseAllocation *)uVar10;
  }
  de::details::
  UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
  ::reset((UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
           *)local_1a8);
  if (local_160 != (pointer)0x0) {
    operator_delete(local_160,(long)local_150 - (long)local_160);
  }
  if ((pointer)local_178.
               super__Vector_base<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
               ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_178.
                    super__Vector_base<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_178.
                          super__Vector_base<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_178.
                          super__Vector_base<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  VStack_120.m_internal = *(deUint64 *)(uVar10 + 8);
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)local_1a8,
                     &this_00->super_DeviceInterface,
                     (this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.
                     m_logicalDevice.super_RefBase<vk::VkDevice_s_*>.m_data.object,
                     (VkBufferCreateInfo *)local_138,(VkAllocationCallbacks *)0x0);
  pVVar13 = pVStack_190;
  pWVar22 = local_198;
  uVar12 = local_1a8._8_8_;
  uVar11 = local_1a8._0_8_;
  local_178.
  super__Vector_base<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_198;
  local_178.
  super__Vector_base<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)pVStack_190;
  local_188._0_8_ = local_1a8._0_8_;
  local_188._8_8_ = local_1a8._8_8_;
  local_1a8._0_8_ = (SparseAllocation *)0x0;
  local_1a8._8_8_ = (pointer)0x0;
  local_198 = (pointer)0x0;
  pVStack_190 = (pointer)0x0;
  if (local_d8.m_internal == 0) {
    DStack_d0.m_device = (VkDevice)pWVar22;
    DStack_d0.m_allocator = (VkAllocationCallbacks *)pVVar13;
    local_d8.m_internal = uVar11;
    DStack_d0.m_deviceIface = (DeviceInterface *)uVar12;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()(&DStack_d0,local_d8);
    local_d8.m_internal = local_188._0_8_;
    DStack_d0.m_deviceIface = (DeviceInterface *)local_188._8_8_;
    DStack_d0.m_device =
         (VkDevice)
         local_178.
         super__Vector_base<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
         ._M_impl.super__Vector_impl_data._M_start;
    DStack_d0.m_allocator =
         (VkAllocationCallbacks *)
         local_178.
         super__Vector_base<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (local_1a8._0_8_ != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)8>_> *)(local_1a8 + 8),
                 (VkBuffer)local_1a8._0_8_);
    }
  }
  bindSparseBuffer((anon_unknown_0 *)this_00,
                   (DeviceInterface *)
                   (this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.
                   m_logicalDevice.super_RefBase<vk::VkDevice_s_*>.m_data.object,
                   (VkDevice)(this->super_SparseBufferTestInstance).m_sparseQueue.queueHandle,
                   (VkQueue)local_d8.m_internal,
                   (VkBuffer)*(deUint64 *)&((VkCommandBuffer_s *)(uVar10 + 0x28))->field_0x0,
                   *(SparseAllocation **)(uVar10 + 0x30));
  bVar3 = (this->super_SparseBufferTestInstance).m_aliased;
  if ((bool)bVar3 == true) {
    ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)local_1a8,
                       &this_00->super_DeviceInterface,
                       (this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.
                       m_logicalDevice.super_RefBase<vk::VkDevice_s_*>.m_data.object,
                       (VkBufferCreateInfo *)local_138,(VkAllocationCallbacks *)0x0);
    pVVar13 = pVStack_190;
    pWVar22 = local_198;
    uVar12 = local_1a8._8_8_;
    uVar11 = local_1a8._0_8_;
    local_178.
    super__Vector_base<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_198;
    local_178.
    super__Vector_base<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)pVStack_190;
    local_188._0_8_ = local_1a8._0_8_;
    local_188._8_8_ = local_1a8._8_8_;
    local_1a8._0_8_ = (SparseAllocation *)0x0;
    local_1a8._8_8_ = (pointer)0x0;
    local_198 = (pointer)0x0;
    pVStack_190 = (pointer)0x0;
    if (local_b8.m_internal == 0) {
      DStack_b0.m_device = (VkDevice)pWVar22;
      DStack_b0.m_allocator = (VkAllocationCallbacks *)pVVar13;
      local_b8.m_internal = uVar11;
      DStack_b0.m_deviceIface = (DeviceInterface *)uVar12;
    }
    else {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()(&DStack_b0,local_b8);
      local_b8.m_internal = local_188._0_8_;
      DStack_b0.m_deviceIface = (DeviceInterface *)local_188._8_8_;
      DStack_b0.m_device =
           (VkDevice)
           local_178.
           super__Vector_base<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
           ._M_impl.super__Vector_impl_data._M_start;
      DStack_b0.m_allocator =
           (VkAllocationCallbacks *)
           local_178.
           super__Vector_base<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (local_1a8._0_8_ != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)8>_> *)(local_1a8 + 8),
                   (VkBuffer)local_1a8._0_8_);
      }
    }
    bindSparseBuffer((anon_unknown_0 *)this_00,
                     (DeviceInterface *)
                     (this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.
                     m_logicalDevice.super_RefBase<vk::VkDevice_s_*>.m_data.object,
                     (VkDevice)(this->super_SparseBufferTestInstance).m_sparseQueue.queueHandle,
                     (VkQueue)local_b8.m_internal,
                     (VkBuffer)*(deUint64 *)&((VkCommandBuffer_s *)(uVar10 + 0x28))->field_0x0,
                     *(SparseAllocation **)(uVar10 + 0x30));
    bVar3 = (this->super_SparseBufferTestInstance).m_aliased;
  }
  if ((bVar3 & 1) == 0) {
    uVar26 = *(ulong *)(uVar10 + 8);
    uVar19 = 0;
  }
  else {
    uVar26 = *(ulong *)(uVar10 + 8);
    uVar19 = uVar26 / *(uint *)uVar10;
    if ((ulong)((*(long *)(uVar10 + 0x30) -
                *(long *)&((VkCommandBuffer_s *)(uVar10 + 0x28))->field_0x0) / 0x28) < 2) {
      uVar19 = 0;
    }
  }
  uVar26 = uVar26 - uVar19;
  pVVar24 = (this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.m_logicalDevice
            .super_RefBase<vk::VkDevice_s_*>.m_data.object;
  makeBufferCreateInfo((VkBufferCreateInfo *)local_188,uVar26,1);
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)local_1a8,
                     &this_00->super_DeviceInterface,pVVar24,(VkBufferCreateInfo *)local_188,
                     (VkAllocationCallbacks *)0x0);
  local_90 = (SparseAllocation *)uVar10;
  local_128 = local_198;
  VStack_120.m_internal = (deUint64)pVStack_190;
  local_138._0_8_ = local_1a8._0_8_;
  local_138._8_8_ = local_1a8._8_8_;
  bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_188,
             &this_00->super_DeviceInterface,
             (this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.
             m_logicalDevice.super_RefBase<vk::VkDevice_s_*>.m_data.object,
             (this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.m_allocator.
             super_UniqueBase<vk::Allocator,_de::DefaultDeleter<vk::Allocator>_>.m_data.ptr,
             (VkBuffer)local_1a8._0_8_,(MemoryRequirement)0x1);
  uVar10 = local_188._0_8_;
  if ((int)(uVar26 >> 4) != 0) {
    uVar19 = uVar26 >> 4 & 0xffffffff;
    puVar17 = (undefined4 *)
              ((long)&((((vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
                          *)(local_188._0_8_ + 0x18))->
                       super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
                       )._M_impl.super__Vector_impl_data._M_start)->offset + 4);
    uVar21 = 0;
    do {
      puVar17[-3] = uVar21 ^ 0x7f;
      *(undefined8 *)(puVar17 + -2) = 0;
      *puVar17 = 0;
      puVar17 = puVar17 + 4;
      uVar21 = uVar21 + 3;
      uVar19 = uVar19 - 1;
    } while (uVar19 != 0);
  }
  ::vk::flushMappedMemoryRange
            (&this_00->super_DeviceInterface,
             (this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.
             m_logicalDevice.super_RefBase<vk::VkDevice_s_*>.m_data.object,
             (VkDeviceMemory)
             (((vector<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_> *)
              local_188._0_8_)->
             super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
             )._M_impl.super__Vector_impl_data._M_finish,
             (VkDeviceSize)
             (((vector<de::SharedPtr<de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>_>,_std::allocator<de::SharedPtr<de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>_>_>_>
                *)&(((vector<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
                      *)local_188._0_8_)->
                   super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
                   )._M_impl.super__Vector_impl_data._M_end_of_storage)->
             super__Vector_base<de::SharedPtr<de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>_>,_std::allocator<de::SharedPtr<de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start,uVar26);
  local_78[0] = 0;
  local_78[1] = 0;
  local_78[2] = 0;
  local_78[3] = 0;
  local_68 = uVar26;
  makeCommandPool((Move<vk::Handle<(vk::HandleType)24>_> *)local_1a8,&this_00->super_DeviceInterface
                  ,(this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.
                   m_logicalDevice.super_RefBase<vk::VkDevice_s_*>.m_data.object,
                  (this->super_SparseBufferTestInstance).m_universalQueue.queueFamilyIndex);
  local_178.
  super__Vector_base<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_198;
  local_178.
  super__Vector_base<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)pVStack_190;
  local_188._0_8_ = local_1a8._0_8_;
  local_188._8_8_ = local_1a8._8_8_;
  ::vk::allocateCommandBuffer
            (&local_f8,&this_00->super_DeviceInterface,
             (this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.
             m_logicalDevice.super_RefBase<vk::VkDevice_s_*>.m_data.object,
             (VkCommandPool)local_1a8._0_8_,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  pVVar15 = local_f8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object;
  local_198 = (pointer)local_f8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device;
  pVStack_190 = (pointer)local_f8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.
                         m_internal;
  local_1a8._0_8_ = local_f8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object;
  local_1a8._8_8_ = local_f8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface;
  beginCommandBuffer(&this_00->super_DeviceInterface,
                     local_f8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  (*(this_00->super_DeviceInterface)._vptr_DeviceInterface[0x5f])
            (this_00,pVVar15,local_138._0_8_,local_d8.m_internal);
  endCommandBuffer(&this_00->super_DeviceInterface,pVVar15);
  submitCommandsAndWait
            (&this_00->super_DeviceInterface,
             (this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.
             m_logicalDevice.super_RefBase<vk::VkDevice_s_*>.m_data.object,
             (this->super_SparseBufferTestInstance).m_universalQueue.queueHandle,pVVar15,0,
             (VkSemaphore *)0x0,(VkPipelineStageFlags *)0x0,0,(VkSemaphore *)0x0);
  if ((SparseAllocation *)pVVar15 != (SparseAllocation *)0x0) {
    local_f8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object = pVVar15;
    (*(code *)(((vector<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_> *)
               local_1a8._8_8_)->
              super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
              )._M_impl.super__Vector_impl_data._M_start[0x18].sampler.m_internal)
              (local_1a8._8_8_,local_198,pVStack_190,1);
  }
  if (local_188._0_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)24>_> *)(local_188 + 8),
               (VkCommandPool)local_188._0_8_);
  }
  (*(code *)(((((vector<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_> *)
               uVar10)->
              super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
              )._M_impl.super__Vector_impl_data._M_start)->imageView).m_internal)(uVar10);
  if (local_138._0_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)8>_> *)(local_138 + 8),(VkBuffer)local_138._0_8_)
    ;
  }
  uVar26 = local_90->resourceSize;
  pVVar16 = Context::getDeviceProperties
                      ((this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.
                       super_TestInstance.m_context);
  uVar21 = (pVVar16->limits).maxUniformBufferRange;
  pVVar24 = (VkDevice)(ulong)uVar21;
  if ((uint)uVar26 < uVar21) {
    pVVar24 = (VkDevice)(uVar26 & 0xffffffff);
  }
  local_98 = __return_storage_ptr__;
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)local_188);
  this_01 = ::vk::DescriptorSetLayoutBuilder::addBinding
                      ((DescriptorSetLayoutBuilder *)local_188,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,1,
                       0x10,(VkSampler *)0x0);
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)local_1a8,this_01,
             &this_00->super_DeviceInterface,
             (this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.
             m_logicalDevice.super_RefBase<vk::VkDevice_s_*>.m_data.object,0);
  pVVar13 = pVStack_190;
  pWVar22 = local_198;
  uVar11 = local_1a8._8_8_;
  uVar10 = local_1a8._0_8_;
  local_128 = local_198;
  VStack_120.m_internal = (deUint64)pVStack_190;
  local_138._0_8_ = local_1a8._0_8_;
  local_138._8_8_ = local_1a8._8_8_;
  local_1a8._0_8_ = (SparseAllocation *)0x0;
  local_1a8._8_8_ = (VkSpecializationMapEntry *)0x0;
  local_198 = (pointer)0x0;
  pVStack_190 = (pointer)0x0;
  pMVar1 = &this->m_descriptorSetLayout;
  VVar4.m_internal =
       (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.
       m_internal;
  if (VVar4.m_internal == 0) {
    (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
    m_device = (VkDevice)pWVar22;
    (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
    m_allocator = (VkAllocationCallbacks *)pVVar13;
    (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.object.m_internal = uVar10;
    (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
    m_deviceIface = (DeviceInterface *)uVar11;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
              (&(this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.
                deleter,VVar4);
    (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
    m_device = (VkDevice)local_128;
    (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
    m_allocator = (VkAllocationCallbacks *)VStack_120.m_internal;
    (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.object.m_internal =
         local_138._0_8_;
    (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
    m_deviceIface = (DeviceInterface *)local_138._8_8_;
    if (local_1a8._0_8_ != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)19>_> *)(local_1a8 + 8),
                 (VkDescriptorSetLayout)local_1a8._0_8_);
    }
  }
  local_198 = (pointer)0x0;
  pVStack_190 = (pointer)0x0;
  local_1a8._0_8_ = (SparseAllocation *)0x0;
  local_1a8._8_8_ = (VkSpecializationMapEntry *)0x0;
  if (local_158 != (pointer)0x0) {
    operator_delete(local_158,(long)local_148 - (long)local_158);
  }
  if ((pointer)local_178.
               super__Vector_base<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
               ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    operator_delete(local_178.
                    super__Vector_base<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
                    ._M_impl.super__Vector_impl_data._M_finish,
                    (long)local_160 -
                    (long)local_178.
                          super__Vector_base<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
  }
  if ((pointer)local_188._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_188._0_8_,
                    (long)local_178.
                          super__Vector_base<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
                          ._M_impl.super__Vector_impl_data._M_start - local_188._0_8_);
  }
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)local_1a8);
  this_02 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)local_1a8,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,1);
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)local_138,this_02,
             &this_00->super_DeviceInterface,
             (this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.
             m_logicalDevice.super_RefBase<vk::VkDevice_s_*>.m_data.object,1,1);
  VVar14.m_internal = VStack_120.m_internal;
  pWVar22 = local_128;
  uVar11 = local_138._8_8_;
  uVar10 = local_138._0_8_;
  local_178.
  super__Vector_base<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_128;
  local_178.
  super__Vector_base<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)VStack_120.m_internal;
  local_188._0_8_ = local_138._0_8_;
  local_188._8_8_ = local_138._8_8_;
  local_138._0_8_ = 0;
  local_138._8_8_ = (DeviceInterface *)0x0;
  local_128 = (pointer)0x0;
  VStack_120.m_internal = 0;
  VVar5.m_internal =
       (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.
       m_internal;
  if (VVar5.m_internal == 0) {
    (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device
         = (VkDevice)pWVar22;
    (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
    m_allocator = (VkAllocationCallbacks *)VVar14.m_internal;
    (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal
         = uVar10;
    (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
    m_deviceIface = (DeviceInterface *)uVar11;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
              (&(this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.
                deleter,VVar5);
    (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device
         = (VkDevice)
           local_178.
           super__Vector_base<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
           ._M_impl.super__Vector_impl_data._M_start;
    (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
    m_allocator = (VkAllocationCallbacks *)
                  local_178.
                  super__Vector_base<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal
         = local_188._0_8_;
    (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
    m_deviceIface = (DeviceInterface *)local_188._8_8_;
    if (local_138._0_8_ != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)21>_> *)(local_138 + 8),
                 (VkDescriptorPool)local_138._0_8_);
    }
  }
  local_128 = (pointer)0x0;
  VStack_120.m_internal = 0;
  local_138._0_8_ = (Allocation *)0x0;
  local_138._8_8_ = (pointer)0x0;
  if ((SparseAllocation *)local_1a8._0_8_ != (SparseAllocation *)0x0) {
    operator_delete((void *)local_1a8._0_8_,(long)local_198 - local_1a8._0_8_);
  }
  makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)local_138,
                    &this_00->super_DeviceInterface,
                    (this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.
                    m_logicalDevice.super_RefBase<vk::VkDevice_s_*>.m_data.object,
                    (VkDescriptorPool)
                    (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.
                    object.m_internal,
                    (VkDescriptorSetLayout)
                    (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.
                    m_data.object.m_internal);
  VVar5.m_internal = VStack_120.m_internal;
  pWVar22 = local_128;
  uVar11 = local_138._8_8_;
  uVar10 = local_138._0_8_;
  local_178.
  super__Vector_base<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_128;
  local_178.
  super__Vector_base<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)VStack_120.m_internal;
  local_188._0_8_ = local_138._0_8_;
  local_188._8_8_ = local_138._8_8_;
  local_138._0_8_ = (Allocation *)0x0;
  local_138._8_8_ = (DeviceInterface *)0x0;
  local_128 = (pointer)0x0;
  VStack_120.m_internal = 0;
  pMVar2 = &this->m_descriptorSet;
  pSVar6 = (SparseAllocation *)
           (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.
           m_internal;
  if (pSVar6 == (SparseAllocation *)0x0) {
    (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device =
         (VkDevice)pWVar22;
    (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.
    m_internal = VVar5.m_internal;
    (pMVar2->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.object.m_internal = uVar10;
    (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
    m_deviceIface = (DeviceInterface *)uVar11;
  }
  else {
    pDVar7 = (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
             m_deviceIface;
    local_1a8._0_8_ = pSVar6;
    (*pDVar7->_vptr_DeviceInterface[0x3d])
              (pDVar7,(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.
                      deleter.m_device,
               (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter
               .m_pool.m_internal,1);
    *(VkBufferCreateFlags *)
     &(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device
         = (VkBufferCreateFlags)
           local_178.
           super__Vector_base<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
           ._M_impl.super__Vector_impl_data._M_start;
    *(undefined4 *)
     ((long)&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
             m_device + 4) =
         local_178.
         super__Vector_base<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
         ._M_impl.super__Vector_impl_data._M_start._4_4_;
    *(undefined4 *)
     &(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.
      m_internal = local_178.
                   super__Vector_base<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
                   ._M_impl.super__Vector_impl_data._M_finish._0_4_;
    *(undefined4 *)
     ((long)&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
             m_pool.m_internal + 4) =
         local_178.
         super__Vector_base<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
         ._M_impl.super__Vector_impl_data._M_finish._4_4_;
    *(undefined4 *)
     &(pMVar2->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.object.m_internal =
         local_188._0_4_;
    *(undefined4 *)
     ((long)&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.
             m_internal + 4) = local_188._4_4_;
    *(undefined4 *)
     &(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
      m_deviceIface = local_188._8_4_;
    *(undefined4 *)
     ((long)&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
             m_deviceIface + 4) = local_188._12_4_;
    if ((Allocation *)local_138._0_8_ != (Allocation *)0x0) {
      local_188._0_8_ = local_138._0_8_;
      (*(*(_func_int ***)local_138._8_8_)[0x3d])(local_138._8_8_,local_128,VStack_120.m_internal,1);
    }
  }
  pVVar20 = &local_d8;
  if ((this->super_SparseBufferTestInstance).m_aliased != false) {
    pVVar20 = &local_b8;
  }
  local_138._0_8_ = pVVar20->m_internal;
  local_138._8_8_ = (DeviceInterface *)0x0;
  local_128 = (pointer)pVVar24;
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)local_188);
  this_03 = (DescriptorSetUpdateBuilder *)
            ::vk::DescriptorSetUpdateBuilder::write
                      ((DescriptorSetUpdateBuilder *)local_188,
                       (int)(pMVar2->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.object.
                            m_internal,(void *)0x0,0);
  ::vk::DescriptorSetUpdateBuilder::update
            (this_03,&this_00->super_DeviceInterface,
             (this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.
             m_logicalDevice.super_RefBase<vk::VkDevice_s_*>.m_data.object);
  if (local_158 != (pointer)0x0) {
    operator_delete(local_158,(long)local_148 - (long)local_158);
  }
  if ((pointer)local_178.
               super__Vector_base<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
               ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    operator_delete(local_178.
                    super__Vector_base<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
                    ._M_impl.super__Vector_impl_data._M_finish,
                    (long)local_160 -
                    (long)local_178.
                          super__Vector_base<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ::~vector((vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
             *)local_188);
  device = (this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.m_logicalDevice.
           super_RefBase<vk::VkDevice_s_*>.m_data.object;
  makeBufferCreateInfo((VkBufferCreateInfo *)local_188,0x40,0x80);
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)local_1a8,
                     &this_00->super_DeviceInterface,device,(VkBufferCreateInfo *)local_188,
                     (VkAllocationCallbacks *)0x0);
  pVVar13 = pVStack_190;
  pWVar22 = local_198;
  uVar11 = local_1a8._8_8_;
  uVar10 = local_1a8._0_8_;
  local_128 = local_198;
  VStack_120.m_internal = (deUint64)pVStack_190;
  local_138._0_8_ = local_1a8._0_8_;
  local_138._8_8_ = local_1a8._8_8_;
  local_1a8._0_8_ = (SparseAllocation *)0x0;
  local_1a8._8_8_ = (VkSpecializationMapEntry *)0x0;
  local_198 = (pointer)0x0;
  pVStack_190 = (pointer)0x0;
  obj.m_internal =
       (this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
  ;
  if (obj.m_internal == 0) {
    (this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
         (VkDevice)pWVar22;
    (this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator
         = (VkAllocationCallbacks *)pVVar13;
    (this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
         uVar10;
    (this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
    m_deviceIface = (DeviceInterface *)uVar11;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&(this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               obj);
    (this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
         (VkDevice)local_128;
    (this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator
         = (VkAllocationCallbacks *)VStack_120.m_internal;
    (this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
         local_138._0_8_;
    (this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
    m_deviceIface = (DeviceInterface *)local_138._8_8_;
    if (local_1a8._0_8_ != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)8>_> *)(local_1a8 + 8),
                 (VkBuffer)local_1a8._0_8_);
    }
  }
  bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_188,
             &this_00->super_DeviceInterface,
             (this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.
             m_logicalDevice.super_RefBase<vk::VkDevice_s_*>.m_data.object,
             (this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.m_allocator.
             super_UniqueBase<vk::Allocator,_de::DefaultDeleter<vk::Allocator>_>.m_data.ptr,
             (VkBuffer)
             (this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal,(MemoryRequirement)0x1);
  uVar10 = local_188._0_8_;
  local_188._0_8_ = (pointer)0x0;
  pWVar22 = (pointer)(this->m_vertexBufferAlloc).
                     super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                     ptr;
  if (pWVar22 != (pointer)uVar10) {
    if (pWVar22 == (pointer)0x0) {
      (this->m_vertexBufferAlloc).
      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
           (Allocation *)uVar10;
      pWVar22 = (pointer)uVar10;
    }
    else {
      (*(code *)(((pWVar22->imageInfos).
                  super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start)->imageView).m_internal)();
      (this->m_vertexBufferAlloc).
      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
           (Allocation *)uVar10;
      pWVar22 = (pointer)uVar10;
      if ((pointer)local_188._0_8_ != (pointer)0x0) {
        (*(code *)(((((vector<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
                       *)local_188._0_8_)->
                    super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
                    )._M_impl.super__Vector_impl_data._M_start)->imageView).m_internal)();
        pWVar22 = (pointer)(this->m_vertexBufferAlloc).
                           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                           m_data.ptr;
      }
    }
  }
  pVVar8 = (pWVar22->bufferInfos).
           super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  (pVVar8->buffer).m_internal = 0xbf800000bf800000;
  pVVar8->offset = 0x3f80000000000000;
  pVVar8->range = 0x3f800000bf800000;
  pVVar8[1].buffer.m_internal = 0x3f80000000000000;
  pVVar8[1].offset = 0xbf8000003f800000;
  pVVar8[1].range = 0x3f80000000000000;
  pVVar8[2].buffer.m_internal = 0x3f8000003f800000;
  pVVar8[2].offset = 0x3f80000000000000;
  pAVar9 = (this->m_vertexBufferAlloc).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  ::vk::flushMappedMemoryRange
            (&this_00->super_DeviceInterface,
             (this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.
             m_logicalDevice.super_RefBase<vk::VkDevice_s_*>.m_data.object,
             (VkDeviceMemory)(pAVar9->m_memory).m_internal,pAVar9->m_offset,0x40);
  local_f8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object = (VkCommandBuffer_s *)0x0;
  local_f8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_f8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device = (VkDevice)0x0;
  VVar23 = (uint)pVVar24 >> 4;
  uVar21 = local_90->numResourceChunks;
  local_188._0_4_ = VVar23;
  std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
            ((vector<int,_std::allocator<int>_> *)&local_f8,(iterator)0x0,(int *)local_188);
  local_188._0_4_ = VVar23 / uVar21;
  if ((VkDevice)local_f8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface ==
      local_f8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              ((vector<int,_std::allocator<int>_> *)&local_f8,
               (iterator)
               local_f8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface,
               (int *)local_188);
  }
  else {
    *(undefined4 *)local_f8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface =
         local_188._0_4_;
    local_f8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)
         ((long)local_f8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface + 4);
  }
  __return_storage_ptr___00 = local_98;
  local_128 = (pointer)0x400000002;
  VStack_120.m_internal = 4;
  local_138._0_8_ = 1;
  local_138._8_8_ = (DeviceInterface *)0x4;
  local_1a8._0_4_ = 2;
  local_1a8._8_8_ = local_138;
  local_198 = (pointer)((long)local_f8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.
                              m_deviceIface -
                       (long)local_f8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  pVStack_190 = (pointer)local_f8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object;
  if (local_198 == (pointer)0x0) {
    pVStack_190 = (pointer)(VkAllocationCallbacks *)0x0;
  }
  local_178.
  super__Vector_base<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)(local_188 + 8);
  local_188._8_8_ = local_188._8_8_ & 0xffffffff00000000;
  local_178.
  super__Vector_base<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_160 = (pointer)0x0;
  local_78[0] = 0x10;
  local_178.
  super__Vector_base<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_178.
       super__Vector_base<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  ppVVar18 = std::
             map<vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>_>_>
             ::operator[]((map<vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>_>_>
                           *)local_188,local_78);
  *ppVVar18 = (mapped_type)local_1a8;
  VVar4.m_internal =
       (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.object.m_internal;
  std::
  _Rb_tree<vk::VkShaderStageFlagBits,_std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>,_std::_Select1st<std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>_>_>
  ::_Rb_tree(&local_60,
             (_Rb_tree<vk::VkShaderStageFlagBits,_std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>,_std::_Select1st<std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>_>_>
              *)local_188);
  SparseBufferTestInstance::draw
            (&this->super_SparseBufferTestInstance,VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP,VVar4,
             (SpecializationMap *)&local_60);
  std::
  _Rb_tree<vk::VkShaderStageFlagBits,_std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>,_std::_Select1st<std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>_>_>
  ::~_Rb_tree(&local_60);
  std::
  _Rb_tree<vk::VkShaderStageFlagBits,_std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>,_std::_Select1st<std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>_>_>
  ::~_Rb_tree((_Rb_tree<vk::VkShaderStageFlagBits,_std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>,_std::_Select1st<std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>_>_>
               *)local_188);
  if ((VkAllocationCallbacks *)local_f8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object !=
      (VkAllocationCallbacks *)0x0) {
    operator_delete(local_f8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
                    (long)local_f8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device -
                    (long)local_f8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  }
  SparseBufferTestInstance::verifyDrawResult
            (__return_storage_ptr___00,&this->super_SparseBufferTestInstance);
  if (local_b8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()(&DStack_b0,local_b8);
  }
  if (local_d8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()(&DStack_d0,local_d8);
  }
  de::details::
  UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
  ::reset(&local_88);
  return __return_storage_ptr___00;
}

Assistant:

tcu::TestStatus iterate (void)
	{
		const DeviceInterface&		vk					= getDeviceInterface();
		MovePtr<SparseAllocation>	sparseAllocation;
		Move<VkBuffer>				sparseBuffer;
		Move<VkBuffer>				sparseBufferAliased;

		// Set up the sparse buffer
		{
			VkBufferCreateInfo	referenceBufferCreateInfo	= getSparseBufferCreateInfo(VK_BUFFER_USAGE_UNIFORM_BUFFER_BIT);
			const VkDeviceSize	minChunkSize				= 512u;	// make sure the smallest allocation is at least this big
			deUint32			numMaxChunks				= 0u;

			// Check how many chunks we can allocate given the alignment and size requirements of UBOs
			{
				const UniquePtr<SparseAllocation> minAllocation(SparseAllocationBuilder()
					.addMemoryBind()
					.build(vk, getDevice(), getAllocator(), referenceBufferCreateInfo, minChunkSize));

				numMaxChunks = deMaxu32(static_cast<deUint32>(m_context.getDeviceProperties().limits.maxUniformBufferRange / minAllocation->resourceSize), 1u);
			}

			if (numMaxChunks < 4)
			{
				sparseAllocation = SparseAllocationBuilder()
					.addMemoryBind()
					.build(vk, getDevice(), getAllocator(), referenceBufferCreateInfo, minChunkSize);
			}
			else
			{
				// Try to use a non-trivial memory allocation scheme to make it different from a non-sparse binding
				SparseAllocationBuilder builder;
				builder.addMemoryBind();

				if (m_residency)
					builder.addResourceHole();

				builder
					.addMemoryAllocation()
					.addMemoryHole()
					.addMemoryBind();

				if (m_aliased)
					builder.addAliasedMemoryBind(0u, 0u);

				sparseAllocation = builder.build(vk, getDevice(), getAllocator(), referenceBufferCreateInfo, minChunkSize);
				DE_ASSERT(sparseAllocation->resourceSize <= m_context.getDeviceProperties().limits.maxUniformBufferRange);
			}

			// Create the buffer
			referenceBufferCreateInfo.size	= sparseAllocation->resourceSize;
			sparseBuffer					= makeBuffer(vk, getDevice(), referenceBufferCreateInfo);
			bindSparseBuffer(vk, getDevice(), m_sparseQueue.queueHandle, *sparseBuffer, *sparseAllocation);

			if (m_aliased)
			{
				sparseBufferAliased = makeBuffer(vk, getDevice(), referenceBufferCreateInfo);
				bindSparseBuffer(vk, getDevice(), m_sparseQueue.queueHandle, *sparseBufferAliased, *sparseAllocation);
			}
		}

		// Set uniform data
		{
			const bool					hasAliasedChunk		= (m_aliased && sparseAllocation->memoryBinds.size() > 1u);
			const VkDeviceSize			chunkSize			= sparseAllocation->resourceSize / sparseAllocation->numResourceChunks;
			const VkDeviceSize			stagingBufferSize	= sparseAllocation->resourceSize - (hasAliasedChunk ? chunkSize : 0);
			const deUint32				numBufferEntries	= static_cast<deUint32>(stagingBufferSize / sizeof(IVec4));

			const Unique<VkBuffer>		stagingBuffer		(makeBuffer(vk, getDevice(), makeBufferCreateInfo(stagingBufferSize, VK_BUFFER_USAGE_TRANSFER_SRC_BIT)));
			const UniquePtr<Allocation>	stagingBufferAlloc	(bindBuffer(vk, getDevice(), getAllocator(), *stagingBuffer, MemoryRequirement::HostVisible));

			{
				// If aliased chunk is used, the staging buffer is smaller than the sparse buffer and we don't overwrite the last chunk
				IVec4* const pData = static_cast<IVec4*>(stagingBufferAlloc->getHostPtr());
				for (deUint32 i = 0; i < numBufferEntries; ++i)
					pData[i] = IVec4(3*i ^ 127, 0, 0, 0);

				flushMappedMemoryRange(vk, getDevice(), stagingBufferAlloc->getMemory(), stagingBufferAlloc->getOffset(), stagingBufferSize);

				const VkBufferCopy copyRegion =
				{
					0ull,						// VkDeviceSize    srcOffset;
					0ull,						// VkDeviceSize    dstOffset;
					stagingBufferSize,			// VkDeviceSize    size;
				};

				const Unique<VkCommandPool>		cmdPool		(makeCommandPool(vk, getDevice(), m_universalQueue.queueFamilyIndex));
				const Unique<VkCommandBuffer>	cmdBuffer	(allocateCommandBuffer(vk, getDevice(), *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

				beginCommandBuffer	(vk, *cmdBuffer);
				vk.cmdCopyBuffer	(*cmdBuffer, *stagingBuffer, *sparseBuffer, 1u, &copyRegion);
				endCommandBuffer	(vk, *cmdBuffer);

				submitCommandsAndWait(vk, getDevice(), m_universalQueue.queueHandle, *cmdBuffer);
				// Once the fence is signaled, the write is also available to the aliasing buffer.
			}
		}

		// Make sure that we don't try to access a larger range than is allowed. This only applies to a single chunk case.
		const deUint32 maxBufferRange = deMinu32(static_cast<deUint32>(sparseAllocation->resourceSize), m_context.getDeviceProperties().limits.maxUniformBufferRange);

		// Descriptor sets
		{
			m_descriptorSetLayout = DescriptorSetLayoutBuilder()
				.addSingleBinding(VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, VK_SHADER_STAGE_FRAGMENT_BIT)
				.build(vk, getDevice());

			m_descriptorPool = DescriptorPoolBuilder()
				.addType(VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER)
				.build(vk, getDevice(), VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u);

			m_descriptorSet = makeDescriptorSet(vk, getDevice(), *m_descriptorPool, *m_descriptorSetLayout);

			const VkBuffer					buffer				= (m_aliased ? *sparseBufferAliased : *sparseBuffer);
			const VkDescriptorBufferInfo	sparseBufferInfo	= makeDescriptorBufferInfo(buffer, 0ull, maxBufferRange);

			DescriptorSetUpdateBuilder()
				.writeSingle(*m_descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, &sparseBufferInfo)
				.update(vk, getDevice());
		}

		// Vertex data
		{
			const Vec4 vertexData[] =
			{
				Vec4(-1.0f, -1.0f, 0.0f, 1.0f),
				Vec4(-1.0f,  1.0f, 0.0f, 1.0f),
				Vec4( 1.0f, -1.0f, 0.0f, 1.0f),
				Vec4( 1.0f,  1.0f, 0.0f, 1.0f),
			};

			const VkDeviceSize	vertexBufferSize	= sizeof(vertexData);

			m_vertexBuffer		= makeBuffer(vk, getDevice(), makeBufferCreateInfo(vertexBufferSize, VK_BUFFER_USAGE_VERTEX_BUFFER_BIT));
			m_vertexBufferAlloc	= bindBuffer(vk, getDevice(), getAllocator(), *m_vertexBuffer, MemoryRequirement::HostVisible);

			deMemcpy(m_vertexBufferAlloc->getHostPtr(), &vertexData[0], vertexBufferSize);
			flushMappedMemoryRange(vk, getDevice(), m_vertexBufferAlloc->getMemory(), m_vertexBufferAlloc->getOffset(), vertexBufferSize);
		}

		// Draw
		{
			std::vector<deInt32> specializationData;
			{
				const deUint32	numBufferEntries	= maxBufferRange / static_cast<deUint32>(sizeof(IVec4));
				const deUint32	numEntriesPerChunk	= numBufferEntries / sparseAllocation->numResourceChunks;

				specializationData.push_back(numBufferEntries);
				specializationData.push_back(numEntriesPerChunk);
			}

			const VkSpecializationMapEntry	specMapEntries[] =
			{
				{
					1u,					// uint32_t    constantID;
					0u,					// uint32_t    offset;
					sizeof(deInt32),	// size_t      size;
				},
				{
					2u,					// uint32_t    constantID;
					sizeof(deInt32),	// uint32_t    offset;
					sizeof(deInt32),	// size_t      size;
				},
			};

			const VkSpecializationInfo specInfo =
			{
				DE_LENGTH_OF_ARRAY(specMapEntries),		// uint32_t                           mapEntryCount;
				specMapEntries,							// const VkSpecializationMapEntry*    pMapEntries;
				sizeInBytes(specializationData),		// size_t                             dataSize;
				getDataOrNullptr(specializationData),	// const void*                        pData;
			};

			Renderer::SpecializationMap	specMap;
			specMap[VK_SHADER_STAGE_FRAGMENT_BIT] = &specInfo;

			draw(VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP, *m_descriptorSetLayout, specMap);
		}

		return verifyDrawResult();
	}